

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  int n;
  int x;
  map_bst<int,_int,_std::less<int>_> m;
  int local_50;
  int local_4c;
  map_bst<int,_int,_std::less<int>_> local_48;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105168) = 0;
  local_48.mRoot = (node *)0x0;
  local_48.mSize = 0;
  std::istream::operator>>((istream *)&std::cin,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shallowest = ",0xd);
  iVar1 = CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf(&local_48,local_48.mRoot);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (0 < local_50) {
    iVar1 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_4c);
      iVar2 = local_4c;
      piVar4 = CP::map_bst<int,_int,_std::less<int>_>::operator[](&local_48,&local_4c);
      *piVar4 = iVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shallowest = ",0xd);
      iVar2 = CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf(&local_48,local_48.mRoot);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      iVar1 = iVar1 + 1;
    } while (iVar1 < local_50);
  }
  CP::map_bst<int,_int,_std::less<int>_>::~map_bst(&local_48);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::map_bst<int,int> m;
  int n;
  std::cin >> n;
  std::cout << "Shallowest = " << m.shallowest_leaf() << std::endl;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    m[x] = x;
    std::cout << "Shallowest = " << m.shallowest_leaf() << std::endl;
  }




}